

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O3

void __thiscall
amrex::CellConservativeLinear::interp
          (CellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,
          int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,int param_11,int param_12,
          RunOn runon)

{
  pointer pBVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  double *pdVar18;
  pointer pBVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  double *pdVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  int iVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  int iVar64;
  long lVar65;
  long lVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  int *piVar70;
  bool bVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar82;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  Box result;
  AsyncArray<amrex::BCRec,_0> async_bcr;
  Elixir cceli;
  FArrayBox ccfab;
  long local_418;
  long local_408;
  double *local_3d8;
  long local_3d0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_378;
  long local_370;
  long local_368;
  ulong local_360;
  int local_2e4;
  int local_2e0;
  int local_2d8;
  int local_2d4;
  long local_2b0;
  ulong local_2a8;
  Box local_168;
  long local_140;
  double *local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  AsyncArray<amrex::BCRec,_0> local_c8;
  undefined1 local_b8 [16];
  pointer local_a8;
  BaseFab<double> local_98;
  undefined1 local_4c [8];
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined8 uStack_38;
  
  uVar68 = (ulong)(uint)ncomp;
  pdVar18 = (crse->super_BaseFab<double>).dptr;
  uVar2 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  lVar58 = (long)(int)uVar2;
  uVar3 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  lVar61 = (long)(int)uVar3;
  uVar4 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  iVar64 = (crse->super_BaseFab<double>).domain.bigend.vect[0];
  iVar5 = (crse->super_BaseFab<double>).domain.bigend.vect[1];
  iVar6 = (crse->super_BaseFab<double>).domain.bigend.vect[2];
  local_138 = (fine->super_BaseFab<double>).dptr;
  local_128 = (long)(fine->super_BaseFab<double>).domain.smallend.vect[0];
  local_120 = (long)(fine->super_BaseFab<double>).domain.smallend.vect[1];
  iVar7 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  iVar8 = (fine->super_BaseFab<double>).domain.bigend.vect[0];
  iVar9 = (fine->super_BaseFab<double>).domain.bigend.vect[1];
  iVar10 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  (*(this->super_Interpolater).super_InterpBase._vptr_InterpBase[3])
            (local_4c,this,fine_region,ratio);
  local_168.bigend.vect[2] = (int)uStack_38;
  local_168.btype.itype = (uint)((ulong)uStack_38 >> 0x20);
  local_168.smallend.vect[0] = local_4c._0_4_;
  local_168.smallend.vect[1] = local_4c._4_4_;
  local_168.smallend.vect[0] = local_168.smallend.vect[0] + 1;
  local_168.smallend.vect[1] = local_168.smallend.vect[1] + 1;
  local_168.smallend.vect[2] = iStack_44 + 1;
  local_168.bigend.vect[0] = iStack_40 + -1;
  local_168.bigend.vect[1] = iStack_3c - 1;
  local_168.bigend.vect[2] = local_168.bigend.vect[2] + -1;
  local_c8.d_data = (BCRec *)0x0;
  local_c8.h_data = (BCRec *)0x0;
  pBVar19 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  FArrayBox::FArrayBox((FArrayBox *)&local_98,&local_168,ncomp * 3,true,false,(Arena *)0x0);
  iVar64 = iVar64 + 1;
  iVar20 = iVar5 + 1;
  lVar35 = (long)(int)(iVar64 - uVar2);
  local_d8 = (long)(int)(iVar20 - uVar3);
  lVar38 = local_d8 * lVar35;
  lVar33 = (long)(int)((iVar6 - uVar4) + 1);
  lVar39 = lVar38 * lVar33;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (pointer)0x0;
  lVar49 = (long)local_98.domain.smallend.vect[0];
  lVar55 = (long)local_98.domain.smallend.vect[2];
  lVar45 = (long)((local_98.domain.bigend.vect[0] - local_98.domain.smallend.vect[0]) + 1);
  local_140 = (long)((local_98.domain.bigend.vect[1] - local_98.domain.smallend.vect[1]) + 1);
  local_130 = local_140 * lVar45;
  lVar40 = (long)((local_98.domain.bigend.vect[2] - local_98.domain.smallend.vect[2]) + 1);
  lVar30 = local_130 * lVar40;
  if (this->do_linear_limiting == false) {
    if (ncomp < 1) goto LAB_005961b1;
    iVar5 = (crse_geom->domain).smallend.vect[2];
    iVar11 = (crse_geom->domain).bigend.vect[2];
    iVar32 = ratio->vect[1];
    iVar12 = (crse_geom->domain).bigend.vect[1];
    lVar40 = (long)(crse_geom->domain).bigend.vect[0];
    iVar13 = (crse_geom->domain).smallend.vect[1];
    lVar33 = (long)(crse_geom->domain).smallend.vect[0];
    iVar14 = ratio->vect[2];
    iVar21 = ratio->vect[0];
    local_360 = 0;
    do {
      if (local_168.smallend.vect[2] <= local_168.bigend.vect[2]) {
        iVar59 = (int)local_360;
        pBVar1 = pBVar19 + local_360;
        lVar55 = (crse_comp + iVar59) * lVar39;
        iVar23 = local_168.smallend.vect[2];
        do {
          if (local_168.smallend.vect[1] <= local_168.bigend.vect[1]) {
            lVar43 = (int)(iVar23 - uVar4) * lVar38;
            lVar34 = (iVar23 - local_98.domain.smallend.vect[2]) * local_130;
            local_408 = (long)local_168.smallend.vect[1];
            do {
              if (local_168.smallend.vect[0] <= local_168.bigend.vect[0]) {
                iVar60 = (int)local_408;
                lVar26 = (int)(iVar60 - uVar3) * lVar35;
                lVar27 = (local_408 - local_98.domain.smallend.vect[1]) * lVar45;
                lVar25 = (long)local_168.smallend.vect[0];
                iVar47 = ~uVar2 + local_168.smallend.vect[0];
                do {
                  iVar22 = (int)(lVar25 + 1);
                  dVar77 = pdVar18[lVar26 + lVar43 + lVar55 + (int)(iVar22 - uVar2)];
                  dVar78 = pdVar18[lVar26 + lVar43 + lVar55 + (int)(~uVar2 + (int)lVar25)];
                  dVar72 = (dVar77 - dVar78) * 0.5;
                  if ((lVar25 == lVar33) && (pBVar1->bc[0] - 3U < 2)) {
                    if (lVar33 + 2 < (long)iVar64) {
                      dVar72 = pdVar18[lVar26 + lVar43 + lVar55 + ((lVar33 + 2) - lVar58)] * -0.1 +
                               dVar77 * 0.6666666666666666 +
                               dVar78 * -1.0666666666666667 +
                               pdVar18[lVar26 + lVar43 + lVar55 + (lVar33 - lVar58)] * 0.5;
                    }
                    else {
                      dVar72 = (dVar78 * -6.0 +
                               pdVar18[lVar26 + lVar43 + lVar55 + (lVar33 - lVar58)] * 5.0 + dVar77)
                               * 0.25;
                    }
                  }
                  if ((lVar25 == lVar40) && (pBVar1->bc[3] - 3U < 2)) {
                    if (lVar40 + -2 < lVar58) {
                      dVar72 = (dVar77 * -6.0 +
                               pdVar18[lVar26 + lVar43 + lVar55 + (lVar40 - lVar58)] * 5.0 + dVar78)
                               * -0.25;
                    }
                    else {
                      dVar72 = pdVar18[lVar26 + lVar43 + lVar55 + ((lVar40 + -2) - lVar58)] * 0.1 +
                               dVar78 * -0.6666666666666666 +
                               dVar77 * 1.0666666666666667 +
                               pdVar18[lVar26 + lVar43 + lVar55 + (lVar40 - lVar58)] * -0.5;
                    }
                  }
                  lVar36 = (long)(int)((int)lVar25 - uVar2);
                  dVar79 = pdVar18[lVar26 + lVar36 + lVar43 + lVar55];
                  dVar78 = (dVar79 - dVar78) + (dVar79 - dVar78);
                  dVar75 = (dVar77 - dVar79) + (dVar77 - dVar79);
                  dVar77 = 0.0;
                  if (0.0 <= dVar75 * dVar78) {
                    dVar77 = ABS(dVar78);
                    dVar75 = ABS(dVar75);
                    if (dVar75 <= dVar77) {
                      dVar77 = dVar75;
                    }
                  }
                  dVar78 = pdVar18[lVar55 + lVar43 + (int)((iVar60 + 1) - uVar3) * lVar35 + lVar36];
                  dVar75 = pdVar18[lVar55 + lVar43 + (int)(~uVar3 + iVar60) * lVar35 + lVar36];
                  dVar73 = (dVar78 - dVar75) * 0.5;
                  if ((local_408 == iVar13) && (pBVar1->bc[1] - 3U < 2)) {
                    if (local_408 + 2 < (long)iVar20) {
                      dVar73 = pdVar18[lVar55 + lVar43 + ((local_408 + 2) - lVar61) * lVar35 +
                                                         lVar36] * -0.1 +
                               dVar78 * 0.6666666666666666 +
                               dVar75 * -1.0666666666666667 + dVar79 * 0.5;
                    }
                    else {
                      dVar73 = (dVar75 * -6.0 + dVar79 * 5.0 + dVar78) * 0.25;
                    }
                  }
                  if ((local_408 == iVar12) && (pBVar1->bc[4] - 3U < 2)) {
                    if (local_408 + -2 < lVar61) {
                      dVar73 = (dVar78 * -6.0 + dVar79 * 5.0 + dVar75) * -0.25;
                    }
                    else {
                      dVar73 = pdVar18[lVar55 + lVar43 + ((local_408 + -2) - lVar61) * lVar35 +
                                                         lVar36] * 0.1 +
                               dVar75 * -0.6666666666666666 +
                               dVar78 * 1.0666666666666667 + dVar79 * -0.5;
                    }
                  }
                  dVar75 = (dVar79 - dVar75) + (dVar79 - dVar75);
                  dVar76 = (dVar78 - dVar79) + (dVar78 - dVar79);
                  dVar78 = 0.0;
                  if (0.0 <= dVar76 * dVar75) {
                    dVar78 = ABS(dVar75);
                    dVar76 = ABS(dVar76);
                    if (dVar76 <= dVar78) {
                      dVar78 = dVar76;
                    }
                  }
                  dVar75 = pdVar18[lVar26 + lVar36 + (int)((iVar23 + 1) - uVar4) * lVar38 + lVar55];
                  dVar76 = pdVar18[lVar26 + lVar36 + (int)(~uVar4 + iVar23) * lVar38 + lVar55];
                  dVar74 = (dVar75 - dVar76) * 0.5;
                  if ((iVar5 == iVar23) && (pBVar1->bc[2] - 3U < 2)) {
                    if (iVar6 < iVar23 + 2) {
                      dVar74 = (dVar76 * -6.0 + dVar79 * 5.0 + dVar75) * 0.25;
                    }
                    else {
                      dVar74 = pdVar18[lVar26 + lVar36 + (int)((iVar23 + 2) - uVar4) * lVar38 +
                                                         lVar55] * -0.1 +
                               dVar75 * 0.6666666666666666 +
                               dVar76 * -1.0666666666666667 + dVar79 * 0.5;
                    }
                  }
                  if ((iVar11 == iVar23) && (pBVar1->bc[5] - 3U < 2)) {
                    if (iVar23 + -2 < (int)uVar4) {
                      dVar74 = (dVar75 * -6.0 + dVar79 * 5.0 + dVar76) * -0.25;
                    }
                    else {
                      dVar74 = pdVar18[lVar26 + lVar36 + (int)((iVar23 + -2) - uVar4) * lVar38 +
                                                         lVar55] * 0.1 +
                               dVar76 * -0.6666666666666666 +
                               dVar75 * 1.0666666666666667 + dVar79 * -0.5;
                    }
                  }
                  dVar76 = (dVar79 - dVar76) + (dVar79 - dVar76);
                  dVar82 = (dVar75 - dVar79) + (dVar75 - dVar79);
                  dVar75 = 0.0;
                  if (0.0 <= dVar82 * dVar76) {
                    dVar75 = ABS(dVar76);
                    dVar82 = ABS(dVar82);
                    if (dVar82 <= dVar75) {
                      dVar75 = dVar82;
                    }
                  }
                  dVar76 = ABS(dVar72);
                  if (dVar77 <= ABS(dVar72)) {
                    dVar76 = dVar77;
                  }
                  dVar76 = dVar76 * (double)((ulong)dVar72 & 0x8000000000000000 | 0x3ff0000000000000
                                            );
                  dVar77 = ABS(dVar73);
                  if (dVar78 <= ABS(dVar73)) {
                    dVar77 = dVar78;
                  }
                  dVar77 = dVar77 * (double)((ulong)dVar73 & 0x8000000000000000 | 0x3ff0000000000000
                                            );
                  dVar78 = ABS(dVar74);
                  if (dVar75 <= ABS(dVar74)) {
                    dVar78 = dVar75;
                  }
                  dVar78 = dVar78 * (double)((ulong)dVar74 & 0x8000000000000000 | 0x3ff0000000000000
                                            );
                  if ((((dVar76 != 0.0) || (NAN(dVar76))) || (dVar77 != 0.0)) || (NAN(dVar77))) {
LAB_00595a77:
                    lVar36 = -1;
                    dVar75 = dVar79;
                    dVar72 = dVar79;
                    do {
                      lVar56 = -1;
                      do {
                        lVar52 = 0;
                        dVar73 = dVar75;
                        dVar74 = dVar72;
                        do {
                          dVar72 = pdVar18[lVar55 + (int)((iVar23 - uVar4) + (int)lVar36) * lVar38 +
                                                    (int)((int)lVar56 + (iVar60 - uVar3)) * lVar35 +
                                                    (long)(iVar47 + (int)lVar52)];
                          dVar75 = dVar72;
                          if (dVar73 <= dVar72) {
                            dVar75 = dVar73;
                          }
                          if (dVar72 <= dVar74) {
                            dVar72 = dVar74;
                          }
                          lVar52 = lVar52 + 1;
                          dVar73 = dVar75;
                          dVar74 = dVar72;
                        } while (lVar52 != 3);
                        lVar56 = lVar56 + 1;
                      } while (lVar56 != 2);
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != 2);
                    auVar80._0_8_ = ABS(dVar76) * (double)(iVar21 + -1);
                    auVar80._8_8_ = ABS(dVar78) * (double)(iVar14 + -1);
                    auVar81._8_8_ = (double)(iVar14 * 2);
                    auVar81._0_8_ = (double)(iVar21 * 2);
                    auVar81 = divpd(auVar80,auVar81);
                    dVar73 = auVar81._8_8_ +
                             (ABS(dVar77) * (double)(iVar32 + -1)) / (double)(iVar32 * 2) +
                             auVar81._0_8_;
                    uVar44 = -(ulong)(dVar72 - dVar79 < dVar73);
                    dVar72 = (double)(~uVar44 & 0x3ff0000000000000 |
                                     (ulong)((dVar72 - dVar79) / dVar73) & uVar44);
                    if (dVar79 - dVar75 < dVar73 * dVar72) {
                      dVar72 = (dVar79 - dVar75) / dVar73;
                    }
                  }
                  else {
                    dVar72 = 1.0;
                    if ((dVar78 != 0.0) || (NAN(dVar78))) goto LAB_00595a77;
                  }
                  lVar36 = lVar25 - lVar49;
                  local_98.dptr[lVar34 + lVar27 + lVar36 + local_360 * lVar30] = dVar76 * dVar72;
                  local_98.dptr[lVar34 + lVar27 + lVar36 + (ncomp + iVar59) * lVar30] =
                       dVar77 * dVar72;
                  local_98.dptr[lVar34 + lVar27 + lVar36 + (ncomp * 2 + iVar59) * lVar30] =
                       dVar78 * dVar72;
                  iVar47 = iVar47 + 1;
                  lVar25 = lVar25 + 1;
                } while (local_168.bigend.vect[0] + 1 != iVar22);
              }
              local_408 = local_408 + 1;
            } while ((int)local_408 != local_168.bigend.vect[1] + 1U);
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 != local_168.bigend.vect[2] + 1);
      }
      local_360 = local_360 + 1;
    } while (local_360 != uVar68);
  }
  else if (local_168.smallend.vect[2] <= local_168.bigend.vect[2]) {
    iVar20 = (crse_geom->domain).smallend.vect[1];
    iVar11 = (crse_geom->domain).smallend.vect[2];
    iVar32 = (crse_geom->domain).bigend.vect[1];
    iVar12 = (crse_geom->domain).bigend.vect[2];
    lVar43 = (long)local_168.smallend.vect[0];
    local_e8 = (ulong)(uint)(ncomp * 2) * lVar40 * 8 + lVar55 * -8;
    local_e0 = lVar40 * uVar68 * 8 + lVar55 * -8;
    local_f0 = crse_comp * lVar33 * 8;
    local_f8 = local_f0 + (long)(int)uVar4 * -8;
    lVar33 = lVar43 * 8 + lVar49 * -8;
    iVar13 = (crse_geom->domain).bigend.vect[0];
    iVar14 = (crse_geom->domain).smallend.vect[0];
    local_100 = (long)local_98.domain.smallend.vect[1] * -8;
    local_108 = -lVar55;
    local_110 = lVar61 * -8;
    iVar21 = local_168.smallend.vect[2] - uVar4;
    local_2d8 = iVar21 + -1;
    local_d0 = (ulong)(uint)local_168.bigend.vect[1];
    local_118 = local_140 * 8;
    local_2e0 = local_168.smallend.vect[2] + 2;
    local_2e4 = local_168.smallend.vect[2] + -2;
    iVar23 = local_168.smallend.vect[2];
    do {
      iVar21 = iVar21 + 1;
      if (local_168.smallend.vect[1] <= local_168.bigend.vect[1]) {
        lVar55 = (long)iVar23;
        lVar61 = (local_f8 + lVar55 * 8) * local_d8;
        lVar40 = local_110 + lVar61;
        iVar59 = local_168.smallend.vect[1];
        do {
          if (local_168.smallend.vect[0] <= local_168.bigend.vect[0]) {
            lVar34 = (long)iVar59;
            lVar69 = ((local_e8 + lVar55 * 8) * local_140 + local_100 + lVar34 * 8) * lVar45;
            lVar62 = ((local_e0 + lVar55 * 8) * local_140 + local_100 + lVar34 * 8) * lVar45;
            lVar25 = ((local_108 + lVar55) * local_118 + local_100 + lVar34 * 8) * lVar45;
            lVar26 = (lVar40 + lVar34 * 8) * lVar35;
            lVar36 = (long)pdVar18 + (lVar40 + (long)(iVar59 + 2) * 8) * lVar35 + lVar58 * -8;
            lVar52 = (long)pdVar18 + (lVar40 + (long)(iVar59 + -2) * 8) * lVar35 + lVar58 * -8;
            lVar65 = (long)pdVar18 +
                     ((local_f8 + (long)local_2e0 * 8) * local_d8 + local_110 + lVar34 * 8) * lVar35
                     + lVar58 * -8;
            lVar56 = (long)pdVar18 +
                     ((local_f8 + (long)local_2e4 * 8) * local_d8 + local_110 + lVar34 * 8) * lVar35
                     + lVar58 * -8;
            lVar27 = (long)pdVar18 +
                     (((long)local_2d8 * 8 + local_f0) * local_d8 + local_110 + lVar34 * 8) * lVar35
                     + lVar58 * -8;
            lVar57 = (long)pdVar18 +
                     ((local_f0 + (long)iVar21 * 8) * local_d8 + local_110 + lVar34 * 8) * lVar35 +
                     lVar58 * -8;
            local_2a8 = (long)pdVar18 +
                        (lVar61 + (long)(int)(~uVar3 + iVar59) * 8) * lVar35 + lVar58 * -8;
            lVar34 = (long)pdVar18 +
                     (lVar61 + (long)(int)((iVar59 + 1) - uVar3) * 8) * lVar35 + lVar58 * -8;
            local_3a8 = (long)pdVar18 + lVar26 + lVar58 * -8;
            local_3b0 = (long)local_98.dptr + lVar69 + lVar49 * -8;
            lVar69 = (long)local_98.dptr + lVar69 + lVar33;
            local_3b8 = (long)local_98.dptr + lVar62 + lVar49 * -8;
            lVar62 = (long)local_98.dptr + lVar62 + lVar33;
            local_2b0 = (long)local_98.dptr + lVar25 + lVar49 * -8;
            lVar25 = (long)local_98.dptr + lVar25 + lVar33;
            local_418 = lVar43;
            iVar47 = ~uVar2 + local_168.smallend.vect[0];
            iVar60 = local_168.smallend.vect[0] - uVar2;
            do {
              iVar60 = iVar60 + 1;
              if (0 < ncomp) {
                lVar28 = lVar57;
                pdVar31 = (double *)(lVar26 + (long)pdVar18);
                uVar44 = local_2a8;
                lVar37 = local_3b8;
                lVar41 = local_2b0;
                lVar46 = lVar27;
                lVar50 = local_3b0;
                uVar53 = uVar68;
                lVar63 = lVar34;
                lVar66 = local_3a8;
                piVar70 = pBVar19->bc + 5;
                dVar77 = 1.0;
                dVar78 = 1.0;
                dVar72 = 1.0;
                local_3d0 = lVar65;
                local_378 = lVar36;
                local_370 = lVar52;
                local_368 = lVar56;
                do {
                  dVar79 = pdVar31[iVar60];
                  dVar75 = pdVar31[iVar47];
                  dVar73 = (dVar79 - dVar75) * 0.5;
                  if ((local_418 == iVar14) && (((BCRec *)(piVar70 + -5))->bc[0] - 3U < 2)) {
                    dVar73 = *(double *)(lVar66 + lVar43 * 8);
                    if (local_418 + 2 < (long)iVar64) {
                      dVar73 = *(double *)(lVar66 + (lVar43 + 2) * 8) * -0.1 +
                               dVar79 * 0.6666666666666666 +
                               dVar75 * -1.0666666666666667 + dVar73 * 0.5;
                    }
                    else {
                      dVar73 = (dVar75 * -6.0 + dVar73 * 5.0 + dVar79) * 0.25;
                    }
                  }
                  if ((local_418 == iVar13) && (piVar70[-2] - 3U < 2)) {
                    dVar73 = *(double *)(lVar66 + lVar43 * 8);
                    if (local_418 + -2 < lVar58) {
                      dVar73 = (dVar79 * -6.0 + dVar73 * 5.0 + dVar75) * -0.25;
                    }
                    else {
                      dVar73 = *(double *)(lVar66 + (lVar43 + -2) * 8) * 0.1 +
                               dVar75 * -0.6666666666666666 +
                               dVar79 * 1.0666666666666667 + dVar73 * -0.5;
                    }
                  }
                  dVar76 = *(double *)(lVar66 + lVar43 * 8);
                  dVar75 = dVar76 - dVar75;
                  dVar79 = dVar79 - dVar76;
                  dVar75 = dVar75 + dVar75;
                  dVar79 = dVar79 + dVar79;
                  dVar76 = 0.0;
                  if (0.0 <= dVar79 * dVar75) {
                    dVar76 = ABS(dVar75);
                    dVar79 = ABS(dVar79);
                    if (dVar79 <= dVar76) {
                      dVar76 = dVar79;
                    }
                  }
                  if ((dVar73 != 0.0) || (dVar79 = dVar77, NAN(dVar73))) {
                    dVar79 = ABS(dVar73);
                    if (dVar76 <= ABS(dVar73)) {
                      dVar79 = dVar76;
                    }
                    dVar79 = (dVar79 * (double)((ulong)dVar73 & 0x8000000000000000 |
                                               0x3ff0000000000000)) / dVar73;
                    if (dVar77 <= dVar79) {
                      dVar79 = dVar77;
                    }
                  }
                  *(double *)(lVar41 + lVar43 * 8) = dVar73;
                  dVar77 = *(double *)(lVar63 + lVar43 * 8);
                  dVar75 = *(double *)(uVar44 + lVar43 * 8);
                  dVar73 = (dVar77 - dVar75) * 0.5;
                  if ((iVar20 == iVar59) && (piVar70[-4] - 3U < 2)) {
                    dVar73 = *(double *)(lVar66 + lVar43 * 8);
                    if (iVar5 < iVar59 + 2) {
                      dVar73 = (dVar75 * -6.0 + dVar73 * 5.0 + dVar77) * 0.25;
                    }
                    else {
                      dVar73 = *(double *)(local_378 + lVar43 * 8) * -0.1 +
                               dVar77 * 0.6666666666666666 +
                               dVar75 * -1.0666666666666667 + dVar73 * 0.5;
                    }
                  }
                  if (iVar32 == iVar59) {
                    dVar76 = *(double *)(lVar66 + lVar43 * 8);
                    if (piVar70[-1] - 3U < 2) {
                      if (iVar59 + -2 < (int)uVar3) {
                        dVar73 = (dVar77 * -6.0 + dVar76 * 5.0 + dVar75) * -0.25;
                      }
                      else {
                        dVar73 = *(double *)(local_370 + lVar43 * 8) * 0.1 +
                                 dVar75 * -0.6666666666666666 +
                                 dVar77 * 1.0666666666666667 + dVar76 * -0.5;
                      }
                    }
                  }
                  else {
                    dVar76 = *(double *)(lVar66 + lVar43 * 8);
                  }
                  dVar75 = (dVar76 - dVar75) + (dVar76 - dVar75);
                  dVar76 = (dVar77 - dVar76) + (dVar77 - dVar76);
                  dVar77 = 0.0;
                  if (0.0 <= dVar76 * dVar75) {
                    dVar77 = ABS(dVar75);
                    dVar76 = ABS(dVar76);
                    if (dVar76 <= dVar77) {
                      dVar77 = dVar76;
                    }
                  }
                  if ((dVar73 != 0.0) || (dVar75 = dVar78, NAN(dVar73))) {
                    dVar75 = ABS(dVar73);
                    if (dVar77 <= ABS(dVar73)) {
                      dVar75 = dVar77;
                    }
                    dVar75 = (dVar75 * (double)((ulong)dVar73 & 0x8000000000000000 |
                                               0x3ff0000000000000)) / dVar73;
                    if (dVar78 <= dVar75) {
                      dVar75 = dVar78;
                    }
                  }
                  *(double *)(lVar37 + lVar43 * 8) = dVar73;
                  dVar77 = *(double *)(lVar28 + lVar43 * 8);
                  dVar78 = *(double *)(lVar46 + lVar43 * 8);
                  dVar73 = (dVar77 - dVar78) * 0.5;
                  if ((iVar11 == iVar23) && (piVar70[-3] - 3U < 2)) {
                    dVar73 = *(double *)(lVar66 + lVar43 * 8);
                    if (iVar6 < iVar23 + 2) {
                      dVar73 = (dVar78 * -6.0 + dVar73 * 5.0 + dVar77) * 0.25;
                    }
                    else {
                      dVar73 = *(double *)(local_3d0 + lVar43 * 8) * -0.1 +
                               dVar77 * 0.6666666666666666 +
                               dVar78 * -1.0666666666666667 + dVar73 * 0.5;
                    }
                  }
                  if (iVar12 == iVar23) {
                    dVar76 = *(double *)(lVar66 + lVar43 * 8);
                    if (*piVar70 - 3U < 2) {
                      if (iVar23 + -2 < (int)uVar4) {
                        dVar73 = (dVar77 * -6.0 + dVar76 * 5.0 + dVar78) * -0.25;
                      }
                      else {
                        dVar73 = *(double *)(local_368 + lVar43 * 8) * 0.1 +
                                 dVar78 * -0.6666666666666666 +
                                 dVar77 * 1.0666666666666667 + dVar76 * -0.5;
                      }
                    }
                  }
                  else {
                    dVar76 = *(double *)(lVar66 + lVar43 * 8);
                  }
                  dVar78 = (dVar76 - dVar78) + (dVar76 - dVar78);
                  dVar76 = (dVar77 - dVar76) + (dVar77 - dVar76);
                  dVar77 = 0.0;
                  if (0.0 <= dVar76 * dVar78) {
                    dVar77 = ABS(dVar78);
                    dVar76 = ABS(dVar76);
                    if (dVar76 <= dVar77) {
                      dVar77 = dVar76;
                    }
                  }
                  if ((dVar73 != 0.0) || (dVar76 = dVar72, NAN(dVar73))) {
                    dVar78 = ABS(dVar73);
                    if (dVar77 <= ABS(dVar73)) {
                      dVar78 = dVar77;
                    }
                    dVar76 = (dVar78 * (double)((ulong)dVar73 & 0x8000000000000000 |
                                               0x3ff0000000000000)) / dVar73;
                    if (dVar72 <= dVar76) {
                      dVar76 = dVar72;
                    }
                  }
                  *(double *)(lVar50 + lVar43 * 8) = dVar73;
                  lVar50 = lVar50 + lVar30 * 8;
                  lVar37 = lVar37 + lVar30 * 8;
                  lVar41 = lVar41 + lVar30 * 8;
                  piVar70 = piVar70 + 6;
                  lVar66 = lVar66 + lVar39 * 8;
                  local_378 = local_378 + lVar39 * 8;
                  local_370 = local_370 + lVar39 * 8;
                  local_3d0 = local_3d0 + lVar39 * 8;
                  local_368 = local_368 + lVar39 * 8;
                  lVar46 = lVar46 + lVar39 * 8;
                  lVar28 = lVar28 + lVar39 * 8;
                  uVar44 = uVar44 + lVar39 * 8;
                  lVar63 = lVar63 + lVar39 * 8;
                  pdVar31 = pdVar31 + lVar39;
                  uVar53 = uVar53 - 1;
                  dVar77 = dVar79;
                  dVar78 = dVar75;
                  dVar72 = dVar76;
                } while (uVar53 != 0);
                lVar28 = 0;
                uVar44 = uVar68;
                do {
                  *(double *)(lVar25 + lVar28) = *(double *)(lVar25 + lVar28) * dVar79;
                  *(double *)(lVar62 + lVar28) = *(double *)(lVar62 + lVar28) * dVar75;
                  *(double *)(lVar69 + lVar28) = *(double *)(lVar69 + lVar28) * dVar76;
                  lVar28 = lVar28 + lVar30 * 8;
                  uVar44 = uVar44 - 1;
                } while (uVar44 != 0);
              }
              local_418 = local_418 + 1;
              local_3b0 = local_3b0 + 8;
              local_3b8 = local_3b8 + 8;
              local_2b0 = local_2b0 + 8;
              local_3a8 = local_3a8 + 8;
              lVar36 = lVar36 + 8;
              lVar52 = lVar52 + 8;
              lVar65 = lVar65 + 8;
              lVar56 = lVar56 + 8;
              lVar27 = lVar27 + 8;
              lVar57 = lVar57 + 8;
              local_2a8 = local_2a8 + 8;
              lVar34 = lVar34 + 8;
              iVar47 = iVar47 + 1;
              lVar69 = lVar69 + 8;
              lVar62 = lVar62 + 8;
              lVar25 = lVar25 + 8;
            } while (local_168.bigend.vect[0] + 1 != (int)local_418);
          }
          iVar59 = iVar59 + 1;
        } while (iVar59 != local_168.bigend.vect[1] + 1U);
      }
      local_2e0 = local_2e0 + 1;
      local_2e4 = local_2e4 + 1;
      local_2d8 = local_2d8 + 1;
      bVar71 = iVar23 != local_168.bigend.vect[2];
      iVar23 = iVar23 + 1;
    } while (bVar71);
  }
  if (0 < ncomp) {
    lVar33 = (long)((iVar8 - (int)local_128) + 1);
    iVar64 = ratio->vect[0];
    iVar5 = ratio->vect[1];
    iVar6 = ratio->vect[2];
    uVar15 = (fine_region->smallend).vect[2];
    uVar16 = (fine_region->bigend).vect[2];
    iVar8 = (fine_region->bigend).vect[0];
    iVar20 = (fine_region->bigend).vect[1];
    iVar11 = (fine_region->smallend).vect[1];
    uVar17 = (fine_region->smallend).vect[0];
    local_138 = local_138 + ((int)uVar17 - local_128);
    local_2a8 = 0;
    local_2d4 = fine_comp;
    do {
      if ((int)uVar15 <= (int)uVar16) {
        iVar32 = (int)local_2a8;
        uVar29 = uVar15;
        do {
          if (iVar11 <= iVar20) {
            local_3d8 = (double *)
                        ((((long)local_2d4 * (long)((iVar10 - iVar7) + 1) * 8 + (long)iVar7 * -8 +
                          (long)(int)uVar29 * 8) * (long)((iVar9 - (int)local_120) + 1) +
                         (long)iVar11 * 8 + local_120 * -8) * lVar33 + (long)local_138);
            uVar44 = (long)iVar11;
            do {
              if ((int)uVar17 <= iVar8) {
                uVar42 = (uint)uVar44;
                pdVar31 = local_3d8;
                uVar53 = (long)(int)uVar17;
                uVar48 = ~uVar17;
                do {
                  uVar51 = (uint)uVar53;
                  if (iVar64 == 4) {
                    if ((long)uVar53 < 0) {
                      uVar54 = (int)uVar51 >> 2;
                    }
                    else {
                      uVar54 = uVar51 >> 2;
                    }
                  }
                  else if (iVar64 == 2) {
                    if ((long)uVar53 < 0) {
                      uVar54 = (int)uVar51 >> 1;
                    }
                    else {
                      uVar54 = uVar51 >> 1;
                    }
                  }
                  else {
                    uVar54 = uVar51;
                    if (iVar64 != 1) {
                      if ((long)uVar53 < 0) {
                        uVar54 = ~((int)uVar48 / iVar64);
                      }
                      else {
                        uVar54 = (uint)((long)((ulong)(uint)((int)uVar51 >> 0x1f) << 0x20 |
                                              uVar53 & 0xffffffff) / (long)iVar64);
                      }
                    }
                  }
                  uVar67 = uVar42;
                  if (((iVar5 != 1) && (uVar67 = (int)uVar42 >> 2, iVar5 != 4)) &&
                     (uVar67 = (int)uVar42 >> 1, iVar5 != 2)) {
                    if ((long)uVar44 < 0) {
                      uVar67 = ~((int)~uVar42 / iVar5);
                    }
                    else {
                      uVar67 = (uint)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                            uVar44 & 0xffffffff) / (long)iVar5);
                    }
                  }
                  uVar24 = uVar29;
                  if (((iVar6 != 1) && (uVar24 = (int)uVar29 >> 2, iVar6 != 4)) &&
                     (uVar24 = (int)uVar29 >> 1, iVar6 != 2)) {
                    if ((int)uVar29 < 0) {
                      uVar24 = ~((int)~uVar29 / iVar6);
                    }
                    else {
                      uVar24 = (int)uVar29 / iVar6;
                    }
                  }
                  lVar49 = (long)(int)(uVar54 - local_98.domain.smallend.vect[0]);
                  lVar55 = (int)(uVar67 - local_98.domain.smallend.vect[1]) * lVar45;
                  lVar40 = (int)(uVar24 - local_98.domain.smallend.vect[2]) * local_130;
                  *pdVar31 = (((double)(int)(uVar29 - uVar24 * iVar6) + 0.5) / (double)iVar6 + -0.5)
                             * local_98.dptr
                               [lVar55 + lVar49 + lVar40 + (ncomp * 2 + iVar32) * lVar30] +
                             (((double)(int)(uVar42 - uVar67 * iVar5) + 0.5) / (double)iVar5 + -0.5)
                             * local_98.dptr[lVar55 + lVar49 + lVar40 + (ncomp + iVar32) * lVar30] +
                             (((double)(int)(-iVar64 * uVar54 + uVar51) + 0.5) / (double)iVar64 +
                             -0.5) * local_98.dptr[lVar55 + lVar49 + lVar40 + local_2a8 * lVar30] +
                             pdVar18[(int)(uVar67 - uVar3) * lVar35 +
                                     (long)(int)(uVar54 - uVar2) +
                                     (int)(uVar24 - uVar4) * lVar38 + (crse_comp + iVar32) * lVar39]
                  ;
                  uVar53 = uVar53 + 1;
                  pdVar31 = pdVar31 + 1;
                  uVar48 = uVar48 - 1;
                } while (iVar8 + 1 != (int)uVar53);
              }
              uVar44 = uVar44 + 1;
              local_3d8 = local_3d8 + lVar33;
            } while (iVar20 + 1 != (int)uVar44);
          }
          bVar71 = uVar29 != uVar16;
          uVar29 = uVar29 + 1;
        } while (bVar71);
      }
      local_2a8 = local_2a8 + 1;
      local_2d4 = local_2d4 + 1;
    } while (local_2a8 != uVar68);
  }
LAB_005961b1:
  Gpu::Elixir::~Elixir((Elixir *)local_b8);
  local_98._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_98);
  Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&local_c8);
  return;
}

Assistant:

void
CellConservativeLinear::interp (const FArrayBox& crse,
                                int              crse_comp,
                                FArrayBox&       fine,
                                int              fine_comp,
                                int              ncomp,
                                const Box&       fine_region,
                                const IntVect&   ratio,
                                const Geometry&  crse_geom,
                                const Geometry&  fine_geom,
                                Vector<BCRec> const& bcr,
                                int              /*actual_comp*/,
                                int              /*actual_state*/,
                                RunOn             runon)
{
    BL_PROFILE("CellConservativeLinear::interp()");
    BL_ASSERT(bcr.size() >= ncomp);

    AMREX_ASSERT(fine.box().contains(fine_region));

    bool run_on_gpu = (runon == RunOn::Gpu && Gpu::inLaunchRegion());

    Box const& cdomain = crse_geom.Domain();
    amrex::ignore_unused(fine_geom);

    Array4<Real const> const& crsearr = crse.const_array();
    Array4<Real> const& finearr = fine.array();

    const Box& crse_region = CoarseBox(fine_region,ratio);
    const Box& cslope_bx = amrex::grow(crse_region,-1);

    AsyncArray<BCRec> async_bcr(bcr.data(), (run_on_gpu) ? ncomp : 0);
    BCRec const* bcrp = (run_on_gpu) ? async_bcr.data() : bcr.data();

    FArrayBox ccfab(cslope_bx, ncomp*AMREX_SPACEDIM);
    Elixir cceli;
    if (run_on_gpu) cceli = ccfab.elixir();
    Array4<Real> const& tmp = ccfab.array();
    Array4<Real const> const& ctmp = ccfab.const_array();

#if (AMREX_SPACEDIM == 1)
    if (crse_geom.IsSPHERICAL()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(j,k);
                mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crsearr, crse_comp, ncomp,
                                                    cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(j,k);
            mf_cell_cons_lin_interp_sph(i, n, finearr, fine_comp, ctmp,
                                        crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#elif (AMREX_SPACEDIM == 2)
    if (crse_geom.IsRZ()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(k);
                mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crsearr, crse_comp, ncomp,
                                                   cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(k);
            mf_cell_cons_lin_interp_rz(i, j, n, finearr, fine_comp, ctmp,
                                       crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#endif
    {
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, ratio, bcrp);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            mf_cell_cons_lin_interp(i,j,k,n, finearr, fine_comp, ctmp,
                                    crsearr, crse_comp, ncomp, ratio);
        });
    }
}